

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer2.c
# Opt level: O0

ktx_error_code_e ktxTexture2_WriteToStdioStream(ktxTexture2 *This,FILE *dstsstr)

{
  FILE *in_RSI;
  long in_RDI;
  ktx_error_code_e result;
  ktxStream stream;
  ktxStream *in_stack_00000100;
  ktxTexture2 *in_stack_00000108;
  ktxStream local_80;
  ktx_error_code_e local_4;
  
  if (in_RDI == 0) {
    local_4 = KTX_INVALID_VALUE;
  }
  else {
    local_4 = ktxFileStream_construct(&local_80,in_RSI,false);
    if (local_4 == KTX_SUCCESS) {
      local_4 = ktxTexture2_WriteToStream(in_stack_00000108,in_stack_00000100);
    }
  }
  return local_4;
}

Assistant:

KTX_error_code
ktxTexture2_WriteToStdioStream(ktxTexture2* This, FILE* dstsstr)
{
    ktxStream stream;
    KTX_error_code result = KTX_SUCCESS;

    if (!This)
        return KTX_INVALID_VALUE;

    result = ktxFileStream_construct(&stream, dstsstr, KTX_FALSE);
    if (result != KTX_SUCCESS)
        return result;

    return ktxTexture2_WriteToStream(This, &stream);
}